

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::InnerMap::InsertUniqueInTree
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_00;
  LogMessage *other;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Base_ptr local_88;
  undefined1 local_80;
  _Base_ptr local_78;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Node *local_20;
  Node *node_local;
  size_type b_local;
  InnerMap *this_local;
  
  local_59 = 0;
  local_20 = node;
  node_local = (Node *)b;
  b_local = (size_type)this;
  if (this->table_[b] != this->table_[b ^ 1]) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x2b8);
    local_59 = 1;
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_20->next = (Node *)0x0;
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             *)this->table_[(long)node_local];
  local_90 = KeyPtrFromNodePtr(local_20);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          ::insert(this_00,&local_90);
  local_88 = (_Base_ptr)pVar1.first._M_node;
  local_80 = pVar1.second;
  local_78 = local_88;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::KeyValuePair>
  ::iterator_base(__return_storage_ptr__,(TreeIterator)local_88,this,
                  (ulong)node_local & 0xfffffffffffffffe);
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is NULL for all Nodes in Trees.
      node->next = NULL;
      return iterator(static_cast<Tree*>(table_[b])
                      ->insert(KeyPtrFromNodePtr(node))
                      .first,
                      this, b & ~static_cast<size_t>(1));
    }